

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O0

optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
* __thiscall hmi::window::wait_event(window *this)

{
  bool bVar1;
  int iVar2;
  undefined8 *in_RSI;
  optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
  *in_RDI;
  int status;
  SDL_Event event;
  Uint32 window_id;
  undefined1 local_48 [60];
  undefined4 local_c;
  
  local_c = SDL_GetWindowID(*in_RSI);
  do {
    iVar2 = SDL_WaitEvent(local_48);
    if (iVar2 == 0) {
      std::
      optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
      ::optional(in_RDI);
      return in_RDI;
    }
    anon_unknown_0::translate_event(event.window.data2,(SDL_Event *)event.syswm.msg);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                        *)0x107512);
  } while (!bVar1);
  return in_RDI;
}

Assistant:

std::optional<window_event> window::wait_event() {
    Uint32 window_id = SDL_GetWindowID(m_window);

    for (;;) {
      SDL_Event event;
      int status = SDL_WaitEvent(&event);

      if (status == 0) {
        return std::nullopt;
      }

      std::optional<window_event> event_maybe = translate_event(window_id, event);

      if (event_maybe) {
        return event_maybe;
      }
    }
  }